

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O1

mz_bool duckdb_miniz::mz_zip_reader_read_central_dir(mz_zip_archive *pZip,mz_uint flags)

{
  ushort *puVar1;
  ushort uVar2;
  uint uVar3;
  mz_zip_internal_state *pmVar4;
  int *piVar5;
  bool bVar6;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  void *pvVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  int *piVar16;
  uint uVar17;
  ulong uVar18;
  short *psVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  mz_uint64 mVar24;
  ulong uVar25;
  uint uVar26;
  size_t new_capacity;
  char cVar27;
  mz_uint32 zip64_end_of_central_dir_header_u32 [14];
  mz_uint32 zip64_end_of_central_dir_locator_u32 [5];
  mz_uint32 buf_u32 [1024];
  int local_1098;
  ulong local_1094;
  uint local_1088;
  uint local_1084;
  uint local_1080;
  char local_107c;
  char local_107b;
  char local_107a;
  char local_1079;
  mz_uint32 local_1078;
  char local_1074;
  char local_1073;
  char local_1072;
  char local_1071;
  uint local_1070;
  char local_106c;
  char local_106b;
  char local_106a;
  char local_1069;
  ulong local_1068;
  int local_1058 [2];
  ulong local_1050;
  int local_1048;
  undefined4 local_1038;
  ushort local_1034;
  ushort local_1032;
  ushort local_1030;
  ushort local_102e;
  uint local_102c;
  uint local_1028;
  
  uVar14 = pZip->m_archive_size;
  if (uVar14 < 0x16) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
      return 0;
    }
    return 0;
  }
  mVar24 = 0;
  if (0x1000 < (long)uVar14) {
    mVar24 = uVar14 - 0x1000;
  }
  do {
    uVar14 = pZip->m_archive_size - mVar24;
    sVar9 = 0x1000;
    if (uVar14 < 0x1000) {
      sVar9 = uVar14;
    }
    sVar7 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar24,&local_1038,sVar9);
    cVar27 = '\x01';
    if (sVar7 == sVar9) {
      if (3 < uVar14) {
        uVar14 = (ulong)((int)sVar9 - 4);
        lVar12 = (long)&local_1038 + uVar14 + 3;
        lVar8 = -(uVar14 + mVar24);
        iVar20 = (int)sVar9 + -3;
        do {
          if ((*(int *)(lVar12 + -3) == 0x6054b50) && (0x15 < pZip->m_archive_size + lVar8)) {
            cVar27 = '\x02';
            mVar24 = -lVar8;
            goto LAB_01874aec;
          }
          lVar12 = lVar12 + -1;
          lVar8 = lVar8 + 1;
          iVar21 = iVar20 + -1;
          bVar6 = 0 < iVar20;
          iVar20 = iVar21;
        } while (iVar21 != 0 && bVar6);
      }
      if (mVar24 != 0) {
        cVar27 = 0x10014 < pZip->m_archive_size - mVar24;
        if (!(bool)cVar27) {
          mVar24 = mVar24 - 0xffd;
        }
      }
    }
LAB_01874aec:
  } while (cVar27 == '\0');
  if (cVar27 != '\x02') {
    pZip->m_last_error = MZ_ZIP_FAILED_FINDING_CENTRAL_DIR;
    return 0;
  }
  sVar9 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar24,&local_1038,0x16);
  if (sVar9 != 0x16) goto LAB_01874fb5;
  if (local_1038 != 0x6054b50) {
LAB_01874b79:
    pZip->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
    return 0;
  }
  if (((0x4b < (long)mVar24) &&
      (sVar9 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar24 - 0x14,local_1058,0x14), sVar9 == 0x14))
     && (local_1058[0] == 0x7064b50)) {
    if (pZip->m_archive_size - 0x38 < local_1050) goto LAB_01874b79;
    sVar9 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_1050,&local_1098,0x38);
    if ((sVar9 == 0x38) && (local_1098 == 0x6064b50)) {
      pZip->m_pState->m_zip64 = 1;
    }
  }
  pZip->m_total_files = (uint)local_102e;
  uVar22 = (uint)local_1034;
  uVar17 = (uint)local_1032;
  uVar15 = (ulong)local_102c;
  uVar14 = (ulong)local_1028;
  pmVar4 = pZip->m_pState;
  uVar13 = (uint)local_1030;
  if (pmVar4->m_zip64 != 0) {
    if (local_1094 < 0x2c) {
      pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
LAB_01874ca7:
      bVar6 = false;
      local_1068 = uVar14;
      local_1080 = (uint)local_1030;
      local_1084 = uVar17;
    }
    else {
      if (local_1048 != 1) {
        pZip->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
        goto LAB_01874ca7;
      }
      if ((((local_1074 != '\0' || local_1073 != '\0') || local_1072 != '\0') || local_1071 != '\0')
         || (pZip->m_total_files = local_1078,
            ((local_107c != '\0' || local_107b != '\0') || local_107a != '\0') || local_1079 != '\0'
            )) {
        pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
        goto LAB_01874ca7;
      }
      if (((local_106c == '\0' && local_106b == '\0') && local_106a == '\0') && local_1069 == '\0')
      {
        bVar6 = true;
        uVar15 = (ulong)local_1070;
        uVar22 = local_1088;
      }
      else {
        pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
        bVar6 = false;
        local_1068 = uVar14;
        local_1084 = uVar17;
      }
    }
    uVar14 = local_1068;
    uVar13 = local_1080;
    uVar17 = local_1084;
    if (!bVar6) {
      return 0;
    }
  }
  uVar3 = pZip->m_total_files;
  if ((uVar3 != uVar13) || ((uVar22 != 0 || uVar17 != 0 && ((uVar22 != 1 || (uVar17 != 1)))))) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
    return 0;
  }
  if (((uint)uVar15 < uVar3 * 0x2e) || (pZip->m_archive_size < uVar14 + uVar15)) {
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  pZip->m_central_directory_file_ofs = uVar14;
  if (uVar3 != 0) {
    if ((pmVar4->m_central_dir).m_capacity < uVar15) {
      pvVar10 = (*pZip->m_pRealloc)(pZip->m_pAlloc_opaque,(pmVar4->m_central_dir).m_p,
                                    (ulong)(pmVar4->m_central_dir).m_element_size,uVar15);
      if (pvVar10 == (void *)0x0) goto LAB_0187501a;
      (pmVar4->m_central_dir).m_p = pvVar10;
      (pmVar4->m_central_dir).m_capacity = uVar15;
    }
    (pmVar4->m_central_dir).m_size = uVar15;
    pmVar4 = pZip->m_pState;
    uVar11 = (ulong)pZip->m_total_files;
    if ((pmVar4->m_central_dir_offsets).m_capacity < uVar11) {
      pvVar10 = (*pZip->m_pRealloc)(pZip->m_pAlloc_opaque,(pmVar4->m_central_dir_offsets).m_p,
                                    (ulong)(pmVar4->m_central_dir_offsets).m_element_size,uVar11);
      if (pvVar10 == (void *)0x0) goto LAB_0187501a;
      (pmVar4->m_central_dir_offsets).m_p = pvVar10;
      (pmVar4->m_central_dir_offsets).m_capacity = uVar11;
    }
    (pmVar4->m_central_dir_offsets).m_size = uVar11;
    if ((flags >> 0xb & 1) == 0) {
      pmVar4 = pZip->m_pState;
      uVar11 = (ulong)pZip->m_total_files;
      if ((pmVar4->m_sorted_central_dir_offsets).m_capacity < uVar11) {
        pvVar10 = (*pZip->m_pRealloc)(pZip->m_pAlloc_opaque,
                                      (pmVar4->m_sorted_central_dir_offsets).m_p,
                                      (ulong)(pmVar4->m_sorted_central_dir_offsets).m_element_size,
                                      uVar11);
        if (pvVar10 == (void *)0x0) {
LAB_0187501a:
          pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
          return 0;
        }
        (pmVar4->m_sorted_central_dir_offsets).m_p = pvVar10;
        (pmVar4->m_sorted_central_dir_offsets).m_capacity = uVar11;
      }
      (pmVar4->m_sorted_central_dir_offsets).m_size = uVar11;
    }
    sVar9 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar14,(pZip->m_pState->m_central_dir).m_p,uVar15);
    if (sVar9 != uVar15) {
LAB_01874fb5:
      pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
      return 0;
    }
    if (pZip->m_total_files != 0) {
      pmVar4 = pZip->m_pState;
      piVar5 = (int *)(pmVar4->m_central_dir).m_p;
      uVar14 = 0;
      piVar16 = piVar5;
      do {
        uVar13 = (uint)uVar15;
        if ((uVar13 < 0x2e) || (*piVar16 != 0x2014b50)) goto LAB_01874f7d;
        *(int *)((long)(pmVar4->m_central_dir_offsets).m_p + uVar14 * 4) =
             (int)piVar16 - (int)piVar5;
        if ((flags >> 0xb & 1) == 0) {
          *(int *)((long)(pmVar4->m_sorted_central_dir_offsets).m_p + uVar14 * 4) = (int)uVar14;
        }
        uVar17 = piVar16[5];
        uVar11 = (ulong)uVar17;
        uVar3 = piVar16[6];
        uVar18 = (ulong)uVar3;
        if ((pmVar4->m_zip64_has_extended_info_fields == 0) &&
           (uVar26 = (uint)*(ushort *)((long)piVar16 + 0x1e), *(ushort *)((long)piVar16 + 0x1e) != 0
           )) {
          uVar25 = uVar18;
          if (uVar18 < uVar11) {
            uVar25 = uVar11;
          }
          uVar23 = (uint)uVar25;
          if (uVar25 <= *(uint *)((long)piVar16 + 0x2a)) {
            uVar23 = *(uint *)((long)piVar16 + 0x2a);
          }
          if (uVar23 == 0xffffffff) {
            psVar19 = (short *)((long)piVar16 + (ulong)*(ushort *)(piVar16 + 7) + 0x2e);
            do {
              if (uVar26 < 4) {
LAB_01874e87:
                pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                iVar20 = 1;
LAB_01874e94:
                bVar6 = false;
              }
              else {
                puVar1 = (ushort *)(psVar19 + 1);
                uVar25 = (ulong)*puVar1 + 4;
                if (uVar26 < uVar25) goto LAB_01874e87;
                if (*psVar19 == 1) {
                  pmVar4->m_zip64 = 1;
                  pmVar4->m_zip64_has_extended_info_fields = 1;
                  iVar20 = 5;
                  goto LAB_01874e94;
                }
                psVar19 = (short *)((long)psVar19 + uVar25);
                uVar26 = (uVar26 - 4) - (uint)*puVar1;
                iVar20 = 0;
                bVar6 = true;
              }
              if (iVar20 != 0) {
                if ((iVar20 != 5) && (!bVar6)) goto LAB_01874f0c;
                break;
              }
            } while (uVar26 != 0);
          }
        }
        if (((uVar17 == 0xffffffff) || (uVar3 == 0xffffffff)) ||
           (((*(int *)((long)piVar16 + 10) != 0 || (uVar3 == uVar17)) &&
            ((uVar18 == 0 || (uVar11 != 0)))))) {
          uVar2 = *(ushort *)((long)piVar16 + 0x22);
          if ((uVar2 == 0xffff) || (uVar2 != 1 && uVar2 != uVar22)) {
            pZip->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
          }
          else {
            if ((uVar17 == 0xffffffff) ||
               (uVar11 + *(uint *)((long)piVar16 + 0x2a) + 0x1e <= pZip->m_archive_size)) {
              if ((*(byte *)((long)piVar16 + 9) & 0x20) != 0) {
                pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
                goto LAB_01874f84;
              }
              uVar17 = (uint)*(ushort *)(piVar16 + 8) +
                       (uint)*(ushort *)((long)piVar16 + 0x1e) + (uint)*(ushort *)(piVar16 + 7) +
                       0x2e;
              if (uVar17 <= uVar13) {
                piVar16 = (int *)((long)piVar16 + (ulong)uVar17);
                bVar6 = true;
                uVar15 = (ulong)(uVar13 - uVar17);
                goto LAB_01874f87;
              }
            }
LAB_01874f7d:
            pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
          }
LAB_01874f84:
          bVar6 = false;
        }
        else {
          pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
LAB_01874f0c:
          bVar6 = false;
        }
LAB_01874f87:
        if (!bVar6) {
          return 0;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < pZip->m_total_files);
    }
  }
  if ((flags >> 0xb & 1) == 0) {
    mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);
    return 1;
  }
  return 1;
}

Assistant:

static mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip, mz_uint flags)
{
    mz_uint cdir_size = 0, cdir_entries_on_this_disk = 0, num_this_disk = 0, cdir_disk_index = 0;
    mz_uint64 cdir_ofs = 0;
    mz_int64 cur_file_ofs = 0;
    const mz_uint8 *p;

    mz_uint32 buf_u32[4096 / sizeof(mz_uint32)];
    mz_uint8 *pBuf = (mz_uint8 *)buf_u32;
    mz_bool sort_central_dir = ((flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0);
    mz_uint32 zip64_end_of_central_dir_locator_u32[(MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pZip64_locator = (mz_uint8 *)zip64_end_of_central_dir_locator_u32;

    mz_uint32 zip64_end_of_central_dir_header_u32[(MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pZip64_end_of_central_dir = (mz_uint8 *)zip64_end_of_central_dir_header_u32;

    mz_uint64 zip64_end_of_central_dir_ofs = 0;

    /* Basic sanity checks - reject files which are too small, and check the first 4 bytes of the file to make sure a local header is there. */
    if (pZip->m_archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    if (!mz_zip_reader_locate_header_sig(pZip, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE, &cur_file_ofs))
        return mz_zip_set_error(pZip, MZ_ZIP_FAILED_FINDING_CENTRAL_DIR);

    /* Read and verify the end of central directory record. */
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_SIG_OFS) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    if (cur_file_ofs >= (MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
    {
        if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs - MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE, pZip64_locator, MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) == MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE)
        {
            if (MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_SIG_OFS) == MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIG)
            {
                zip64_end_of_central_dir_ofs = MZ_READ_LE64(pZip64_locator + MZ_ZIP64_ECDL_REL_OFS_TO_ZIP64_ECDR_OFS);
                if (zip64_end_of_central_dir_ofs > (pZip->m_archive_size - MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
                    return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

                if (pZip->m_pRead(pZip->m_pIO_opaque, zip64_end_of_central_dir_ofs, pZip64_end_of_central_dir, MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE) == MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)
                {
                    if (MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIG_OFS) == MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIG)
                    {
                        pZip->m_pState->m_zip64 = MZ_TRUE;
                    }
                }
            }
        }
    }

    pZip->m_total_files = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS);
    cdir_entries_on_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
    num_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_THIS_DISK_OFS);
    cdir_disk_index = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_DISK_CDIR_OFS);
    cdir_size = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_SIZE_OFS);
    cdir_ofs = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_OFS_OFS);

    if (pZip->m_pState->m_zip64)
    {
        mz_uint32 zip64_total_num_of_disks = MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_TOTAL_NUMBER_OF_DISKS_OFS);
        mz_uint64 zip64_cdir_total_entries = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_TOTAL_ENTRIES_OFS);
        mz_uint64 zip64_cdir_total_entries_on_this_disk = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
        mz_uint64 zip64_size_of_end_of_central_dir_record = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIZE_OF_RECORD_OFS);
        mz_uint64 zip64_size_of_central_directory = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_SIZE_OFS);

        if (zip64_size_of_end_of_central_dir_record < (MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE - 12))
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

        if (zip64_total_num_of_disks != 1U)
            return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

        /* Check for miniz's practical limits */
        if (zip64_cdir_total_entries > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

        pZip->m_total_files = (mz_uint32)zip64_cdir_total_entries;

        if (zip64_cdir_total_entries_on_this_disk > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

        cdir_entries_on_this_disk = (mz_uint32)zip64_cdir_total_entries_on_this_disk;

        /* Check for miniz's current practical limits (sorry, this should be enough for millions of files) */
        if (zip64_size_of_central_directory > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

        cdir_size = (mz_uint32)zip64_size_of_central_directory;

        num_this_disk = MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_NUM_THIS_DISK_OFS);

        cdir_disk_index = MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_NUM_DISK_CDIR_OFS);

        cdir_ofs = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_OFS_OFS);
    }

    if (pZip->m_total_files != cdir_entries_on_this_disk)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    if (((num_this_disk | cdir_disk_index) != 0) && ((num_this_disk != 1) || (cdir_disk_index != 1)))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    if (cdir_size < pZip->m_total_files * MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if ((cdir_ofs + (mz_uint64)cdir_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    pZip->m_central_directory_file_ofs = cdir_ofs;

    if (pZip->m_total_files)
    {
        mz_uint i, n;
        /* Read the entire central directory into a heap block, and allocate another heap block to hold the unsorted central dir file record offsets, and possibly another to hold the sorted indices. */
        if ((!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir, cdir_size, MZ_FALSE)) ||
            (!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir_offsets, pZip->m_total_files, MZ_FALSE)))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (sort_central_dir)
        {
            if (!mz_zip_array_resize(pZip, &pZip->m_pState->m_sorted_central_dir_offsets, pZip->m_total_files, MZ_FALSE))
                return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs, pZip->m_pState->m_central_dir.m_p, cdir_size) != cdir_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

        /* Now create an index into the central directory file records, do some basic sanity checking on each record */
        p = (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p;
        for (n = cdir_size, i = 0; i < pZip->m_total_files; ++i)
        {
            mz_uint total_header_size, disk_index, bit_flags, filename_size, ext_data_size;
            mz_uint64 comp_size, decomp_size, local_header_ofs;

            if ((n < MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) || (MZ_READ_LE32(p) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG))
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, i) = (mz_uint32)(p - (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p);

            if (sort_central_dir)
                MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_sorted_central_dir_offsets, mz_uint32, i) = i;

            comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
            decomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
            local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
            filename_size = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
            ext_data_size = MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS);

            if ((!pZip->m_pState->m_zip64_has_extended_info_fields) &&
                (ext_data_size) &&
                (MZ_MAX(MZ_MAX(comp_size, decomp_size), local_header_ofs) == MZ_UINT32_MAX))
            {
                /* Attempt to find zip64 extended information field in the entry's extra data */
                mz_uint32 extra_size_remaining = ext_data_size;

                if (extra_size_remaining)
                {
                    const mz_uint8 *pExtra_data = p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size;

                    do
                    {
                        mz_uint32 field_id;
                        mz_uint32 field_data_size;

                        if (extra_size_remaining < (sizeof(mz_uint16) * 2))
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        field_id = MZ_READ_LE16(pExtra_data);
                        field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));

                        if ((field_data_size + sizeof(mz_uint16) * 2) > extra_size_remaining)
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
                        {
                            /* Ok, the archive didn't have any zip64 headers but it uses a zip64 extended information field so mark it as zip64 anyway (this can occur with infozip's zip util when it reads compresses files from stdin). */
                            pZip->m_pState->m_zip64 = MZ_TRUE;
                            pZip->m_pState->m_zip64_has_extended_info_fields = MZ_TRUE;
                            break;
                        }

                        pExtra_data += sizeof(mz_uint16) * 2 + field_data_size;
                        extra_size_remaining = extra_size_remaining - sizeof(mz_uint16) * 2 - field_data_size;
                    } while (extra_size_remaining);
                }
            }

            /* I've seen archives that aren't marked as zip64 that uses zip64 ext data, argh */
            if ((comp_size != MZ_UINT32_MAX) && (decomp_size != MZ_UINT32_MAX))
            {
                if (((!MZ_READ_LE32(p + MZ_ZIP_CDH_METHOD_OFS)) && (decomp_size != comp_size)) || (decomp_size && !comp_size))
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            disk_index = MZ_READ_LE16(p + MZ_ZIP_CDH_DISK_START_OFS);
            if ((disk_index == MZ_UINT16_MAX) || ((disk_index != num_this_disk) && (disk_index != 1)))
                return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

            if (comp_size != MZ_UINT32_MAX)
            {
                if (((mz_uint64)MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS) + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + comp_size) > pZip->m_archive_size)
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            bit_flags = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
            if (bit_flags & MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_LOCAL_DIR_IS_MASKED)
                return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

            if ((total_header_size = MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS)) > n)
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            n -= total_header_size;
            p += total_header_size;
        }
    }

    if (sort_central_dir)
        mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);

    return MZ_TRUE;
}